

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

FloatConstantTexture *
pbrt::FloatConstantTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  int iVar1;
  undefined4 extraout_var;
  allocator<char> local_3d;
  Float local_3c;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"value",&local_3d);
  local_3c = TextureParameterDictionary::GetOneFloat(parameters,&local_38,1.0);
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4);
  ((FloatConstantTexture *)CONCAT44(extraout_var,iVar1))->value = local_3c;
  std::__cxx11::string::~string((string *)&local_38);
  return (FloatConstantTexture *)CONCAT44(extraout_var,iVar1);
}

Assistant:

FloatConstantTexture *FloatConstantTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    const FileLoc *loc, Allocator alloc) {
    return alloc.new_object<FloatConstantTexture>(parameters.GetOneFloat("value", 1.f));
}